

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O0

void __thiscall CMU462::Matrix3x3::operator+=(Matrix3x3 *this,Matrix3x3 *B)

{
  double *pdVar1;
  double *pdVar2;
  double *Bij;
  double *Aij;
  Matrix3x3 *A;
  Matrix3x3 *B_local;
  Matrix3x3 *this_local;
  
  pdVar1 = &this->entries[0].y;
  this->entries[0].x = B->entries[0].x + this->entries[0].x;
  pdVar2 = &this->entries[0].z;
  *pdVar1 = B->entries[0].y + *pdVar1;
  *pdVar2 = B->entries[0].z + *pdVar2;
  pdVar1 = &this->entries[1].y;
  this->entries[1].x = B->entries[1].x + this->entries[1].x;
  pdVar2 = &this->entries[1].z;
  *pdVar1 = B->entries[1].y + *pdVar1;
  *pdVar2 = B->entries[1].z + *pdVar2;
  pdVar1 = &this->entries[2].y;
  this->entries[2].x = B->entries[2].x + this->entries[2].x;
  pdVar2 = &this->entries[2].z;
  *pdVar1 = B->entries[2].y + *pdVar1;
  *pdVar2 = B->entries[2].z + *pdVar2;
  return;
}

Assistant:

void Matrix3x3::operator+=( const Matrix3x3& B ) {

    Matrix3x3& A( *this );
    double* Aij = (double*) &A;
    const double* Bij = (const double*) &B;

    *Aij++ += *Bij++;
    *Aij++ += *Bij++;
    *Aij++ += *Bij++;
    *Aij++ += *Bij++;
    *Aij++ += *Bij++;
    *Aij++ += *Bij++;
    *Aij++ += *Bij++;
    *Aij++ += *Bij++;
    *Aij++ += *Bij++;
  }